

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_seeking.c
# Opt level: O2

int check_rsi_seek(test_state *state)

{
  int iVar1;
  uchar *puVar2;
  uchar *puVar3;
  
  iVar1 = state->bytes_per_sample;
  puVar2 = state->ubuf;
  for (puVar3 = puVar2; puVar3 < puVar2 + state->buf_len;
      puVar3 = puVar3 + (long)state->bytes_per_sample * 2) {
    (*state->out)(puVar3,state->xmax - ((long)puVar2 - (long)puVar3) % 0x40,iVar1);
    (*state->out)(puVar3 + iVar1,state->xmin,iVar1);
    puVar2 = state->ubuf;
  }
  printf("Checking seeking ... ");
  iVar1 = check_block_sizes_seek(state);
  if (iVar1 == 0) {
    puts("\x1b[0;32mPASS\x1b[0m");
  }
  return iVar1;
}

Assistant:

int check_rsi_seek(struct test_state *state)
{
    int status;
    int size = state->bytes_per_sample;

    for (unsigned char *tmp = state->ubuf;
         tmp < state->ubuf + state->buf_len;
         tmp += 2 * state->bytes_per_sample) {
        state->out(tmp, state->xmax - ((state->ubuf - tmp) % 64), size);
        state->out(tmp + size, state->xmin, size);
    }

    printf("Checking seeking ... ");
    status = check_block_sizes_seek(state);
    if (status)
        return status;

    printf ("%s\n", CHECK_PASS);
    return 0;
}